

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::dampClusters(btSoftBody *this)

{
  int iVar1;
  int iVar2;
  Cluster **ppCVar3;
  Node **ppNVar4;
  long in_RDI;
  btScalar bVar5;
  btVector3 vx;
  Node *n;
  int j;
  Cluster *c;
  int i;
  btScalar *in_stack_ffffffffffffff58;
  btVector3 *v1;
  btVector3 *v2;
  undefined4 in_stack_ffffffffffffff70;
  btScalar in_stack_ffffffffffffff74;
  btVector3 local_68;
  btScalar local_58 [4];
  btScalar local_48 [4];
  btScalar local_38 [4];
  Node *local_28;
  int local_1c;
  Cluster *local_18;
  int local_c;
  
  for (local_c = 0; iVar1 = local_c,
      iVar2 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
      iVar1 < iVar2; local_c = local_c + 1) {
    ppCVar3 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_c);
    local_18 = *ppCVar3;
    if (0.0 < local_18->m_ndamping) {
      for (local_1c = 0; iVar1 = local_1c,
          iVar2 = btAlignedObjectArray<btSoftBody::Node_*>::size(&local_18->m_nodes), iVar1 < iVar2;
          local_1c = local_1c + 1) {
        ppNVar4 = btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_18->m_nodes,local_1c);
        local_28 = *ppNVar4;
        if (0.0 < local_28->m_im) {
          v2 = &local_18->m_lv;
          v1 = &local_18->m_av;
          btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_18->m_nodes,local_1c);
          local_58 = (btScalar  [4])
                     operator-((btVector3 *)
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),v2);
          local_48 = (btScalar  [4])btCross(v1,(btVector3 *)in_stack_ffffffffffffff58);
          local_38 = (btScalar  [4])
                     operator+((btVector3 *)
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),v2);
          in_stack_ffffffffffffff74 = btVector3::length2((btVector3 *)0x278c4c);
          bVar5 = btVector3::length2((btVector3 *)0x278c63);
          if (in_stack_ffffffffffffff74 <= bVar5) {
            in_stack_ffffffffffffff58 = &local_18->m_ndamping;
            operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),v2)
            ;
            local_68 = ::operator*(v1->m_floats,(btVector3 *)in_stack_ffffffffffffff58);
            btVector3::operator+=(&local_28->m_v,&local_68);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void					btSoftBody::dampClusters()
{
	int i;

	for(i=0;i<m_clusters.size();++i)
	{
		Cluster&	c=*m_clusters[i];	
		if(c.m_ndamping>0)
		{
			for(int j=0;j<c.m_nodes.size();++j)
			{
				Node&			n=*c.m_nodes[j];
				if(n.m_im>0)
				{
					const btVector3	vx=c.m_lv+btCross(c.m_av,c.m_nodes[j]->m_q-c.m_com);
					if(vx.length2()<=n.m_v.length2())
						{
						n.m_v	+=	c.m_ndamping*(vx-n.m_v);
						}
				}
			}
		}
	}
}